

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<char16_t>_> * __thiscall
kj::encodeUtf16(EncodingResult<kj::Array<char16_t>_> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char> text,bool nulTerminate)

{
  char *pcVar1;
  kj kVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  size_t sVar6;
  char *pcVar7;
  Vector<char16_t> local_68;
  uint local_3c;
  EncodingResult<kj::Array<char16_t>_> *local_38;
  
  pcVar4 = text.ptr;
  uVar3 = (uint)text.size_;
  bVar5 = false;
  local_68.builder.ptr =
       (char16_t *)
       _::HeapArrayDisposer::allocateImpl
                 (2,0,(size_t)(pcVar4 + uVar3),(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                 );
  local_68.builder.endPtr = local_68.builder.ptr + (long)(pcVar4 + uVar3);
  local_68.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (pcVar4 != (char *)0x0) {
    bVar5 = false;
    pcVar7 = (char *)0x0;
    local_3c = uVar3;
    local_38 = __return_storage_ptr__;
    do {
      pcVar1 = pcVar7 + 1;
      kVar2 = this[(long)pcVar7];
      if ((char)kVar2 < '\0') {
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar6 = (long)local_68.builder.endPtr - (long)local_68.builder.ptr;
          if (sVar6 == 0) {
            sVar6 = 4;
          }
          Vector<char16_t>::setCapacity(&local_68,sVar6);
        }
        *local_68.builder.pos = L'�';
        bVar5 = true;
      }
      else {
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar6 = (long)local_68.builder.endPtr - (long)local_68.builder.ptr;
          if (sVar6 == 0) {
            sVar6 = 4;
          }
          Vector<char16_t>::setCapacity(&local_68,sVar6);
        }
        *local_68.builder.pos = (ushort)(byte)kVar2;
      }
      local_68.builder.pos = local_68.builder.pos + 1;
      __return_storage_ptr__ = local_38;
      pcVar7 = pcVar1;
      uVar3 = local_3c;
    } while (pcVar1 < pcVar4);
  }
  if ((char)uVar3 != '\0') {
    if (local_68.builder.pos == local_68.builder.endPtr) {
      sVar6 = 4;
      if ((long)local_68.builder.endPtr - (long)local_68.builder.ptr != 0) {
        sVar6 = (long)local_68.builder.endPtr - (long)local_68.builder.ptr;
      }
      Vector<char16_t>::setCapacity(&local_68,sVar6);
    }
    *local_68.builder.pos = L'\0';
    local_68.builder.pos = local_68.builder.pos + 1;
  }
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<char16_t>::setCapacity
              (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr >> 1);
  }
  (__return_storage_ptr__->super_Array<char16_t>).ptr = local_68.builder.ptr;
  (__return_storage_ptr__->super_Array<char16_t>).size_ =
       (long)local_68.builder.pos - (long)local_68.builder.ptr >> 1;
  (__return_storage_ptr__->super_Array<char16_t>).disposer = local_68.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar5;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<char16_t>> encodeUtf16(ArrayPtr<const char> text, bool nulTerminate) {
  return encodeUtf<char16_t>(text, nulTerminate);
}